

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O3

size_t pstore::repo::generic_section::
       size_bytes<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
                 (pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>
                  *d,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
                     *i,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
                        *x)

{
  internal_fixup *piVar1;
  internal_fixup *piVar2;
  external_fixup *peVar3;
  external_fixup *peVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  
  uVar6 = (long)(d->second).pos_ - (long)(d->first).pos_;
  piVar1 = (i->first)._M_current;
  piVar2 = (i->second)._M_current;
  lVar8 = (long)piVar2 - (long)piVar1;
  peVar3 = (x->first)._M_current;
  peVar4 = (x->second)._M_current;
  uVar9 = (long)peVar4 - (long)peVar3;
  if (-1 < (long)((lVar8 >> 3) * -0x5555555555555555 | uVar6 | uVar9)) {
    sVar7 = (uVar6 + 0x17 & 0xfffffffffffffff8) + lVar8;
    if (piVar2 == piVar1) {
      sVar7 = uVar6 + 0x10;
    }
    sVar5 = (sVar7 + 7 & 0xfffffffffffffff8) + uVar9;
    if (peVar4 == peVar3) {
      sVar5 = sVar7;
    }
    return sVar5;
  }
  assert_failed("data_size >= 0 && num_ifixups >= 0 && num_xfixups >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/generic_section.hpp"
                ,0x178);
}

Assistant:

std::size_t generic_section::size_bytes (DataRange const & d, IFixupRange const & i,
                                                 XFixupRange const & x) {
            auto const data_size = std::distance (d.first, d.second);
            auto const num_ifixups = std::distance (i.first, i.second);
            auto const num_xfixups = std::distance (x.first, x.second);
            PSTORE_ASSERT (data_size >= 0 && num_ifixups >= 0 && num_xfixups >= 0);
            return size_bytes (static_cast<std::size_t> (data_size),
                               static_cast<std::size_t> (num_ifixups),
                               static_cast<std::size_t> (num_xfixups));
        }